

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Pop
          (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,iterator it)

{
  iterator it_00;
  iterator iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  bool isLast;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  iterator it_local;
  
  it_local.Tree =
       (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)it.Position;
  this_local = it.Tree;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Data);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x91,
                  "iterator cmLinkedTree<std::basic_string<char>>::Pop(iterator) [T = std::basic_string<char>]"
                 );
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Data);
  if (sVar3 == sVar4) {
    it_00.Position = (PositionType)it_local.Tree;
    it_00.Tree = this_local;
    bVar2 = IsLast(this,it_00);
    iterator::operator++((iterator *)&this_local);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->Data);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->UpPositions);
    }
    iVar1.Position = (PositionType)it_local.Tree;
    iVar1.Tree = this_local;
    return iVar1;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0x92,
                "iterator cmLinkedTree<std::basic_string<char>>::Pop(iterator) [T = std::basic_string<char>]"
               );
}

Assistant:

iterator Pop(iterator it)
  {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast) {
      this->Data.pop_back();
      this->UpPositions.pop_back();
    }
    return it;
  }